

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O2

unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
 __thiscall
wabt::intrusive_list<(anonymous_namespace)::TestObject>::extract
          (intrusive_list<(anonymous_namespace)::TestObject> *this,iterator pos)

{
  long lVar1;
  TestObject *pTVar2;
  TestObject *pTVar3;
  bool bVar4;
  reference pTVar5;
  TestObject *pTVar6;
  iterator rhs;
  iterator local_20;
  
  local_20.list_ = (intrusive_list<(anonymous_namespace)::TestObject> *)pos.node_;
  rhs.list_ = (TestObject *)pos.list_;
  lVar1._0_4_ = (rhs.list_)->data;
  lVar1._4_4_ = (rhs.list_)->data2;
  if (lVar1 == 0) {
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                  ,0x223,
                  "std::unique_ptr<T> wabt::intrusive_list<(anonymous namespace)::TestObject>::extract(iterator) [T = (anonymous namespace)::TestObject]"
                 );
  }
  rhs.node_ = (TestObject *)0x0;
  bVar4 = iterator::operator!=(&local_20,rhs);
  if (bVar4) {
    pTVar5 = iterator::operator*(&local_20);
    if (((rhs.list_)->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ ==
        ((rhs.list_)->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_) {
      ((rhs.list_)->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
           (TestObject *)0x0;
      ((rhs.list_)->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ =
           (TestObject *)0x0;
    }
    else {
      pTVar2 = (pTVar5->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
      pTVar3 = (pTVar5->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_;
      pTVar6 = pTVar3;
      if (pTVar3 == (TestObject *)0x0) {
        pTVar6 = rhs.list_;
      }
      (pTVar6->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = pTVar2;
      if (pTVar2 == (TestObject *)0x0) {
        ((rhs.list_)->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = pTVar3;
      }
      else {
        (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = pTVar3;
      }
    }
    (pTVar5->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = (TestObject *)0x0
    ;
    (pTVar5->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = (TestObject *)0x0
    ;
    *(long *)&(rhs.list_)->data = *(long *)&(rhs.list_)->data + -1;
    this->first_ = pTVar5;
    return (__uniq_ptr_data<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>,_true,_true>
              )this;
  }
  __assert_fail("pos != end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                ,0x224,
                "std::unique_ptr<T> wabt::intrusive_list<(anonymous namespace)::TestObject>::extract(iterator) [T = (anonymous namespace)::TestObject]"
               );
}

Assistant:

inline std::unique_ptr<T> intrusive_list<T>::extract(iterator pos) {
  assert(!empty());
  assert(pos != end());
  T* node = &*pos;
  if (first_ == last_) {
    first_ = last_ = nullptr;
  } else {
    if (node->prev_) {
      node->prev_->next_ = node->next_;
    } else {
      first_ = node->next_;
    }

    if (node->next_) {
      node->next_->prev_ = node->prev_;
    } else {
      last_ = node->prev_;
    }
  }
  node->next_ = node->prev_ = nullptr;
  size_--;
  return std::unique_ptr<T>(node);
}